

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

bool __thiscall
ON_ClassArray<ON_BrepRegion>::QuickSort
          (ON_ClassArray<ON_BrepRegion> *this,_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *compar)

{
  uint uVar1;
  
  if (this->m_a != (ON_BrepRegion *)0x0) {
    uVar1 = this->m_count;
    if (compar != (_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *)0x0 && 0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      ON_qsort(this->m_a,(long)(int)uVar1,0x78,(_func_int_void_ptr_void_ptr *)compar);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ClassArray<T>::QuickSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar ) 
  {
    if ( m_count > 1 )
      ON_qsort( m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    rc = true;
  }
  return rc;
}